

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FiguresTests.cpp
# Opt level: O2

void __thiscall agge::tests::RectangleTests::RectangleIteratorListsItsVertices(RectangleTests *this)

{
  int iVar1;
  allocator local_1b9;
  undefined1 local_1b8 [32];
  int local_198;
  point local_194;
  point local_188;
  point local_17c;
  undefined1 local_168 [24];
  point local_150;
  point local_144;
  point local_138;
  point local_12c;
  point local_118;
  undefined8 local_10c;
  int local_104;
  undefined8 local_100;
  int local_f8;
  undefined8 local_f4;
  int local_ec;
  undefined8 local_e8;
  undefined4 local_e0;
  undefined8 local_dc;
  undefined4 local_d4;
  point local_c8;
  point local_bc;
  point local_b0;
  point local_a4;
  point local_98;
  point local_8c;
  string local_80;
  LocationInfo local_60;
  rectangle r2;
  rectangle r1;
  
  rectangle::rectangle(&r1,10.1,20.2,30.0,4.7);
  local_c8 = vertex<agge::rectangle>(&r1);
  local_bc = vertex<agge::rectangle>(&r1);
  local_b0 = vertex<agge::rectangle>(&r1);
  local_a4 = vertex<agge::rectangle>(&r1);
  local_98 = vertex<agge::rectangle>(&r1);
  local_8c = vertex<agge::rectangle>(&r1);
  local_118.x = 10.1;
  local_118.y = 20.2;
  local_118.command = 1;
  local_10c = 0x41a1999a41f00000;
  iVar1 = 2;
  local_100 = 0x4096666641f00000;
  local_f4 = 0x409666664121999a;
  local_e8 = 0;
  local_e0 = 0x30;
  local_dc = 0;
  local_d4 = 0;
  local_104 = iVar1;
  local_f8 = iVar1;
  local_ec = iVar1;
  std::__cxx11::string::string
            ((string *)local_1b8,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/FiguresTests.cpp"
             ,(allocator *)&local_60);
  ut::LocationInfo::LocationInfo((LocationInfo *)local_168,(string *)local_1b8,0x76);
  ut::are_equal<agge::tests::mocks::path::point,agge::tests::mocks::path::point,6ul>
            ((point (*) [6])&local_118,(point (*) [6])&local_c8,(LocationInfo *)local_168);
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  rectangle::rectangle(&r2,11.1,12.2,13.3,1.7);
  local_168._0_12_ = (undefined1  [12])vertex<agge::rectangle>(&r2);
  local_168._12_12_ = (undefined1  [12])vertex<agge::rectangle>(&r2);
  local_150 = vertex<agge::rectangle>(&r2);
  local_144 = vertex<agge::rectangle>(&r2);
  local_138 = vertex<agge::rectangle>(&r2);
  local_12c = vertex<agge::rectangle>(&r2);
  local_1b8._0_8_ = (pointer)0x414333334131999a;
  local_1b8._8_4_ = 1;
  local_1b8._12_4_ = 13.3;
  local_1b8._16_4_ = 12.2;
  local_1b8._24_8_ = 0x3fd9999a4154cccd;
  local_194.x = 11.1;
  local_194.y = 1.7;
  local_188.x = 0.0;
  local_188.y = 0.0;
  local_188.command = 0x30;
  local_17c.x = 0.0;
  local_17c.y = 0.0;
  local_17c.command = 0;
  local_1b8._20_4_ = iVar1;
  local_198 = iVar1;
  local_194.command = iVar1;
  std::__cxx11::string::string
            ((string *)&local_80,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/FiguresTests.cpp"
             ,&local_1b9);
  ut::LocationInfo::LocationInfo(&local_60,&local_80,0x84);
  ut::are_equal<agge::tests::mocks::path::point,agge::tests::mocks::path::point,6ul>
            ((point (*) [6])local_1b8,(point (*) [6])local_168,&local_60);
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  return;
}

Assistant:

test( RectangleIteratorListsItsVertices )
			{
				// INIT
				rectangle r1(10.1f, 20.2f, 30.0f, 4.7f);

				// ACT
				mocks::path::point points1[] = { vertex(r1), vertex(r1), vertex(r1), vertex(r1), vertex(r1), vertex(r1), };

				// ASSERT
				mocks::path::point reference1[] = {
					moveto(10.1f, 20.2f), lineto(30.0f, 20.2f), lineto(30.0f, 4.7f), lineto(10.1f, 4.7f),
					{ 0.0f, 0.0f, path_command_end_poly | path_flag_close }, stop(),
				};

				assert_equal(reference1, points1);

				// INIT
				rectangle r2(11.1f, 12.2f, 13.3f, 1.7f);

				// ACT
				mocks::path::point points2[] = { vertex(r2), vertex(r2), vertex(r2), vertex(r2), vertex(r2), vertex(r2), };

				// ASSERT
				mocks::path::point reference2[] = {
					moveto(11.1f, 12.2f), lineto(13.3f, 12.2f), lineto(13.3f, 1.7f), lineto(11.1f, 1.7f),
					{ 0.0f, 0.0f, path_command_end_poly | path_flag_close }, stop(),
				};

				assert_equal(reference2, points2);
			}